

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_resolve.cpp
# Opt level: O2

void __thiscall tst_helpers_resolve::voidFuture(tst_helpers_resolve *this)

{
  QSharedData *pQVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  PromiseData<void> *pPVar5;
  long lVar6;
  anon_class_1_0_00000001_for__M_head_impl *in_RDX;
  anon_class_1_0_00000001_for__M_head_impl *f;
  long lVar7;
  QtConcurrent *in_RSI;
  QFutureInterfaceBase *this_00;
  PromiseResolver<void> resolver_2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_e0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_d8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_d0;
  Type p2;
  QPromiseBase<void> local_b8;
  undefined **local_a8;
  PromiseData<void> *local_a0;
  undefined **local_98;
  PromiseData<void> *local_90;
  Type p1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_78;
  Type p0;
  QFuture<void> v1;
  QFuture<void> v0;
  
  this_00 = &v0.d;
  QtConcurrent::run<tst_helpers_resolve::voidFuture()::__0&>((QFuture<void> *)this_00,in_RSI,in_RDX)
  ;
  QFutureInterfaceBase::QFutureInterfaceBase(&v1.d,this_00);
  QtConcurrent::run<tst_helpers_resolve::voidFuture()::__0&>
            ((QFuture<void> *)&p1,(QtConcurrent *)this_00,f);
  p0.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001224c0;
  pPVar5 = (PromiseData<void> *)operator_new(0x58);
  (pPVar5->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar5->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (pPVar5->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (pPVar5->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (pPVar5->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (pPVar5->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar5->super_PromiseDataBase<void,_void_()>).m_lock = 0;
  *(undefined8 *)&(pPVar5->super_PromiseDataBase<void,_void_()>).m_settled = 0;
  (pPVar5->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&(pPVar5->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
  (pPVar5->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData(pPVar5);
  LOCK();
  pQVar1 = &(pPVar5->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar5 != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar5->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_b8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00122478;
  local_b8.m_d.d = pPVar5;
  p0.super_QPromiseBase<void>.m_d.d = pPVar5;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver
            ((PromiseResolver<void> *)&p2,(QPromise<void> *)&local_b8);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_b8);
  if (p2.super_QPromiseBase<void>._vptr_QPromiseBase == (_func_int **)0x0) {
    resolver_2.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)p2.super_QPromiseBase<void>._vptr_QPromiseBase =
         *(int *)p2.super_QPromiseBase<void>._vptr_QPromiseBase + 1;
    UNLOCK();
    resolver_2.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
         p2.super_QPromiseBase<void>._vptr_QPromiseBase;
  }
  local_e0.d = (Data *)0x0;
  if (resolver_2.m_d.d == (Data *)0x0) {
    local_d0.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)resolver_2.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver_2.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_d0 = resolver_2.m_d.d;
  }
  local_d8.d = (Data *)0x0;
  QtPromisePrivate::PromiseFulfill<QFuture<void>_>::call
            ((QFuture<void> *)&p1,(QPromiseResolve<void> *)&resolver_2,
             (QPromiseReject<void> *)&local_d0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_d0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_d8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_2.m_d);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_e0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)&p2);
  p0.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00122478;
  QFutureInterfaceBase::~QFutureInterfaceBase((QFutureInterfaceBase *)&p1);
  p1.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001224c0;
  pPVar5 = (PromiseData<void> *)operator_new(0x58);
  (pPVar5->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar5->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (pPVar5->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (pPVar5->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (pPVar5->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (pPVar5->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar5->super_PromiseDataBase<void,_void_()>).m_lock = 0;
  *(undefined8 *)&(pPVar5->super_PromiseDataBase<void,_void_()>).m_settled = 0;
  (pPVar5->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&(pPVar5->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
  (pPVar5->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData(pPVar5);
  LOCK();
  pQVar1 = &(pPVar5->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar5 != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar5->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_b8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00122478;
  local_b8.m_d.d = pPVar5;
  p1.super_QPromiseBase<void>.m_d.d = pPVar5;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver
            ((PromiseResolver<void> *)&p2,(QPromise<void> *)&local_b8);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_b8);
  if (p2.super_QPromiseBase<void>._vptr_QPromiseBase == (_func_int **)0x0) {
    p2.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)0x0;
  }
  else {
    LOCK();
    *(int *)p2.super_QPromiseBase<void>._vptr_QPromiseBase =
         *(int *)p2.super_QPromiseBase<void>._vptr_QPromiseBase + 1;
    UNLOCK();
  }
  local_e0.d = (Data *)0x0;
  if ((Data *)p2.super_QPromiseBase<void>._vptr_QPromiseBase == (Data *)0x0) {
    local_d0.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)p2.super_QPromiseBase<void>._vptr_QPromiseBase)->super_QSharedData).ref.
    super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i
         = (((Data *)p2.super_QPromiseBase<void>._vptr_QPromiseBase)->super_QSharedData).ref.
           super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_d0.d = (Data *)p2.super_QPromiseBase<void>._vptr_QPromiseBase;
  }
  local_d8.d = (Data *)0x0;
  resolver_2.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       p2.super_QPromiseBase<void>._vptr_QPromiseBase;
  QtPromisePrivate::PromiseFulfill<QFuture<void>_>::call
            (&v0,(QPromiseResolve<void> *)&resolver_2,(QPromiseReject<void> *)&local_d0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_d0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_d8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_2.m_d);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_e0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)&p2);
  p1.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00122478;
  p2.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001224c0;
  pPVar5 = (PromiseData<void> *)operator_new(0x58);
  (pPVar5->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar5->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (pPVar5->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (pPVar5->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (pPVar5->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (pPVar5->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar5->super_PromiseDataBase<void,_void_()>).m_lock = 0;
  *(undefined8 *)&(pPVar5->super_PromiseDataBase<void,_void_()>).m_settled = 0;
  (pPVar5->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&(pPVar5->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
  (pPVar5->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData(pPVar5);
  LOCK();
  pQVar1 = &(pPVar5->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar5 != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar5->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_b8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00122478;
  p2.super_QPromiseBase<void>.m_d.d = pPVar5;
  local_b8.m_d.d = pPVar5;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_2,(QPromise<void> *)&local_b8);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_b8);
  if (resolver_2.m_d.d == (Data *)0x0) {
    local_e0.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
    local_e0 = resolver_2.m_d.d;
  }
  local_d0.d = (Data *)0x0;
  if (local_e0.d == (Data *)0x0) {
    local_d8.d = (Data *)0x0;
  }
  else {
    LOCK();
    ((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_d8.d = local_e0.d;
  }
  local_78.d = (Data *)0x0;
  QtPromisePrivate::PromiseFulfill<QFuture<void>_>::call
            (&v1,(QPromiseResolve<void> *)&local_e0,(QPromiseReject<void> *)&local_d8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_d8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_78);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_e0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_d0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_2.m_d);
  p2.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00122478;
  local_b8.m_d = (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_>)
                 (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_>)
                 p0.super_QPromiseBase<void>.m_d.d;
  if (p0.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_b8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00122478;
  local_a0 = p1.super_QPromiseBase<void>.m_d.d;
  if (p1.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((p1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_a8 = &PTR__QPromiseBase_00122478;
  local_90 = p2.super_QPromiseBase<void>.m_d.d;
  if (p2.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((p2.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_98 = &PTR__QPromiseBase_00122478;
  lVar7 = 0;
  do {
    lVar6 = lVar7;
    if (lVar6 == 0x30) break;
    bVar2 = QtPromise::QPromiseBase<void>::isPending
                      ((QPromiseBase<void> *)((long)&local_b8._vptr_QPromiseBase + lVar6));
    resolver_2.m_d.d._0_1_ = bVar2;
    local_e0.d._0_1_ = 1;
    bVar2 = QTest::qCompare<bool,bool>
                      ((bool *)&resolver_2,(bool *)&local_e0,"promise.isPending()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_resolve.cpp"
                       ,0x10e);
    lVar7 = lVar6 + 0x10;
  } while (bVar2);
  lVar7 = 0x20;
  do {
    QtPromise::QPromiseBase<void>::~QPromiseBase
              ((QPromiseBase<void> *)((long)&local_b8._vptr_QPromiseBase + lVar7));
    lVar7 = lVar7 + -0x10;
  } while (lVar7 != -0x10);
  if (lVar6 == 0x30) {
    local_b8.m_d = (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_>)
                   (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_>)
                   p0.super_QPromiseBase<void>.m_d.d;
    if (p0.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
      LOCK();
      pQVar1 = &((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
                super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_b8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00122478;
    local_a0 = p1.super_QPromiseBase<void>.m_d.d;
    if (p1.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
      LOCK();
      pQVar1 = &((p1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
                super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_a8 = &PTR__QPromiseBase_00122478;
    local_90 = p2.super_QPromiseBase<void>.m_d.d;
    if (p2.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
      LOCK();
      pQVar1 = &((p2.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
                super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_98 = &PTR__QPromiseBase_00122478;
    lVar7 = 0;
    do {
      if (lVar7 == 0x30) break;
      resolver_2.m_d.d._0_4_ = 0xffffffff;
      local_e0.d._0_4_ = 0x2a;
      iVar4 = waitForValue<int>((QPromise<void> *)((long)&local_b8._vptr_QPromiseBase + lVar7),
                                (int *)&resolver_2,(int *)&local_e0);
      cVar3 = QTest::qCompare(iVar4,0x2a,"waitForValue(promise, -1, 42)","42",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_resolve.cpp"
                              ,0x111);
      lVar7 = lVar7 + 0x10;
    } while (cVar3 != '\0');
    lVar7 = 0x20;
    do {
      QtPromise::QPromiseBase<void>::~QPromiseBase
                ((QPromiseBase<void> *)((long)&local_b8._vptr_QPromiseBase + lVar7));
      lVar7 = lVar7 + -0x10;
    } while (lVar7 != -0x10);
  }
  QtPromise::QPromiseBase<void>::~QPromiseBase(&p2.super_QPromiseBase<void>);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&p1.super_QPromiseBase<void>);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&p0.super_QPromiseBase<void>);
  QFutureInterfaceBase::~QFutureInterfaceBase(&v1.d);
  QFutureInterfaceBase::~QFutureInterfaceBase(&v0.d);
  return;
}

Assistant:

void tst_helpers_resolve::voidFuture()
{
    auto fn = []() {};
    QFuture<void> v0 = QtConcurrent::run(fn);
    const QFuture<void> v1 = v0;

    auto p0 = QtPromise::resolve(QtConcurrent::run(fn));
    auto p1 = QtPromise::resolve(v0);
    auto p2 = QtPromise::resolve(v1);

    Q_STATIC_ASSERT((std::is_same<decltype(p0), QtPromise::QPromise<void>>::value));
    Q_STATIC_ASSERT((std::is_same<decltype(p1), QtPromise::QPromise<void>>::value));
    Q_STATIC_ASSERT((std::is_same<decltype(p2), QtPromise::QPromise<void>>::value));

    for (const auto& promise : {p0, p1, p2}) {
        QCOMPARE(promise.isPending(), true);
    }
    for (const auto& promise : {p0, p1, p2}) {
        QCOMPARE(waitForValue(promise, -1, 42), 42);
    }
}